

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O1

double soplex::computeScalingVec<double>
                 (SVSetBase<double> *vecset,vector<double,_std::allocator<double>_> *coScaleval,
                 vector<double,_std::allocator<double>_> *scaleval,double epsilon)

{
  double dVar1;
  Nonzero<double> *pNVar2;
  long lVar3;
  Item *pIVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if ((vecset->set).thenum < 1) {
    dVar7 = 0.0;
  }
  else {
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    lVar6 = 0;
    dVar7 = 0.0;
    do {
      pIVar4 = (vecset->set).theitem + (vecset->set).thekey[lVar6].idx;
      ::soplex::infinity::__tls_init();
      lVar3 = (long)(pIVar4->data).super_SVectorBase<double>.memused;
      dVar9 = dVar1;
      if (lVar3 < 1) {
        dVar8 = 0.0;
      }
      else {
        pNVar2 = (pIVar4->data).super_SVectorBase<double>.m_elem;
        dVar8 = 0.0;
        lVar5 = 0;
        do {
          dVar10 = ABS(*(double *)((long)&pNVar2->val + lVar5) *
                       (coScaleval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[*(uint *)((long)&pNVar2->idx + lVar5)]);
          if (epsilon < dVar10) {
            dVar11 = dVar10;
            if (dVar10 <= dVar8) {
              dVar11 = dVar8;
            }
            dVar8 = dVar11;
            if (dVar10 < dVar9) {
              dVar9 = dVar10;
            }
          }
          lVar5 = lVar5 + 0x10;
        } while (lVar3 * 0x10 != lVar5);
      }
      ::soplex::infinity::__tls_init();
      dVar10 = 1.0;
      dVar11 = 1.0;
      if (dVar9 != dVar1 && dVar8 != 0.0) {
        dVar10 = dVar8;
        dVar11 = dVar9;
      }
      dVar9 = dVar11 * dVar10;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      (scaleval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar6] = 1.0 / dVar9;
      dVar9 = dVar10 / dVar11;
      if (dVar10 / dVar11 <= dVar7) {
        dVar9 = dVar7;
      }
      dVar7 = dVar9;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (vecset->set).thenum);
  }
  return dVar7;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}